

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O1

PaError PaAlsaStream_HandleXrun(PaAlsaStream *self)

{
  PaUnixMutex *self_00;
  snd_pcm_t *psVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  size_t __n;
  int iVar5;
  undefined1 *puVar6;
  char *format;
  uint uVar7;
  PaError PVar8;
  undefined1 *__s;
  undefined8 uStack_50;
  undefined1 auStack_48 [8];
  long local_40;
  snd_timestamp_t t;
  
  uStack_50 = 0x113d29;
  t.tv_usec = (__suseconds_t)PaUtil_GetTime();
  uStack_50 = 0x113d33;
  __n = snd_pcm_status_sizeof();
  lVar2 = -(__n + 0xf & 0xfffffffffffffff0);
  __s = auStack_48 + lVar2;
  iVar5 = 0;
  *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x113d54;
  memset(__s,0,__n);
  uVar4 = 0;
  if ((self->playback).pcm != (snd_pcm_t *)0x0) {
    *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x113d6c;
    puVar6 = __s;
    snd_pcm_status();
    iVar5 = (int)puVar6;
    *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x113d74;
    iVar3 = snd_pcm_status_get_state(__s);
    uVar4 = 0;
    if (iVar3 == 4) {
      iVar5 = (int)&local_40;
      *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x113d88;
      snd_pcm_status_get_trigger_tstamp(__s);
      self->underrun =
           (double)t.tv_usec * 1000.0 - ((double)local_40 * 1000.0 + (double)t.tv_sec / 1000.0);
      uVar4 = 1;
      if ((self->playback).canMmap == 0) {
        psVar1 = (self->playback).pcm;
        iVar5 = -0x20;
        *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x113ddd;
        uVar4 = snd_pcm_recover(psVar1,0xffffffe0,0);
        uVar4 = uVar4 >> 0x1f;
      }
    }
  }
  uVar7 = uVar4;
  if ((self->capture).pcm != (snd_pcm_t *)0x0) {
    *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x113dfc;
    puVar6 = __s;
    snd_pcm_status();
    iVar5 = (int)puVar6;
    *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x113e04;
    iVar3 = snd_pcm_status_get_state(__s);
    if (iVar3 == 4) {
      iVar5 = (int)&local_40;
      *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x113e18;
      snd_pcm_status_get_trigger_tstamp(__s);
      self->overrun =
           (double)t.tv_usec * 1000.0 - ((double)local_40 * 1000.0 + (double)t.tv_sec / 1000.0);
      uVar7 = 1;
      if ((self->capture).canMmap == 0) {
        psVar1 = (self->capture).pcm;
        iVar5 = -0x20;
        *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x113e75;
        iVar3 = snd_pcm_recover(psVar1,0xffffffe0,0);
        uVar7 = uVar4;
        if (iVar3 < 0) {
          uVar7 = 1;
        }
      }
    }
  }
  if (uVar7 == 0) {
    return 0;
  }
  self_00 = &self->stateMtx;
  *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x113e99;
  paUtilErr_ = PaUnixMutex_Lock(self_00);
  if (paUtilErr_ < 0) {
    format = 
    "Expression \'PaUnixMutex_Lock( &stream->stateMtx )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3239\n"
    ;
  }
  else {
    *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x113eaf;
    paUtilErr_ = AlsaStop(self,iVar5);
    if (paUtilErr_ < 0) {
      format = 
      "Expression \'AlsaStop( stream, 0 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3240\n"
      ;
    }
    else {
      *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x113ec5;
      paUtilErr_ = AlsaStart(self,iVar5);
      iVar5 = 0;
      if (-1 < paUtilErr_) goto LAB_00113ed6;
      format = 
      "Expression \'AlsaStart( stream, 0 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3241\n"
      ;
    }
  }
  *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x113f67;
  PaUtil_DebugPrint(format);
  iVar5 = paUtilErr_;
LAB_00113ed6:
  *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x113ede;
  paUtilErr_ = PaUnixMutex_Unlock(self_00);
  while (paUtilErr_ < 0) {
    *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x113f15;
    PaUtil_DebugPrint(
                     "Expression \'PaUnixMutex_Unlock( &stream->stateMtx )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3246\n"
                     );
    iVar5 = paUtilErr_;
    *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x113f24;
    paUtilErr_ = PaUnixMutex_Unlock(self_00);
  }
  PVar8 = 0;
  paUtilErr_ = iVar5;
  if (iVar5 < 0) {
    *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x113f47;
    PaUtil_DebugPrint(
                     "Expression \'AlsaRestart( self )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3308\n"
                     );
    PVar8 = paUtilErr_;
  }
  return PVar8;
}

Assistant:

static PaError PaAlsaStream_HandleXrun( PaAlsaStream *self )
{
    PaError result = paNoError;
    snd_pcm_status_t *st;
    PaTime now = PaUtil_GetTime();
    snd_timestamp_t t;
    int restartAlsa = 0; /* do not restart Alsa by default */

    alsa_snd_pcm_status_alloca( &st );

    if( self->playback.pcm )
    {
        alsa_snd_pcm_status( self->playback.pcm, st );
        if( alsa_snd_pcm_status_get_state( st ) == SND_PCM_STATE_XRUN )
        {
            alsa_snd_pcm_status_get_trigger_tstamp( st, &t );
            self->underrun = now * 1000 - ( (PaTime)t.tv_sec * 1000 + (PaTime)t.tv_usec / 1000 );

            if( !self->playback.canMmap )
            {
                if( alsa_snd_pcm_recover( self->playback.pcm, -EPIPE, 0 ) < 0 )
                {
                    PA_DEBUG(( "%s: [playback] non-MMAP-PCM failed recovering from XRUN, will restart Alsa\n", __FUNCTION__ ));
                    ++ restartAlsa; /* did not manage to recover */
                }
            }
            else
                ++ restartAlsa; /* always restart MMAPed device */
        }
    }
    if( self->capture.pcm )
    {
        alsa_snd_pcm_status( self->capture.pcm, st );
        if( alsa_snd_pcm_status_get_state( st ) == SND_PCM_STATE_XRUN )
        {
            alsa_snd_pcm_status_get_trigger_tstamp( st, &t );
            self->overrun = now * 1000 - ((PaTime) t.tv_sec * 1000 + (PaTime) t.tv_usec / 1000);

            if (!self->capture.canMmap)
            {
                if (alsa_snd_pcm_recover( self->capture.pcm, -EPIPE, 0 ) < 0)
                {
                    PA_DEBUG(( "%s: [capture] non-MMAP-PCM failed recovering from XRUN, will restart Alsa\n", __FUNCTION__ ));
                    ++ restartAlsa; /* did not manage to recover */
                }
            }
            else
                ++ restartAlsa; /* always restart MMAPed device */
        }
    }

    if( restartAlsa )
    {
        PA_DEBUG(( "%s: restarting Alsa to recover from XRUN\n", __FUNCTION__ ));
        PA_ENSURE( AlsaRestart( self ) );
    }

end:
    return result;
error:
    goto end;
}